

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-chunk.c
# Opt level: O0

chunk_conflict * chunk_write(chunk_conflict *c)

{
  bitflag *flags1;
  chunk *c_00;
  loc_conflict lVar1;
  square_conflict *psVar2;
  chunk_conflict *new;
  wchar_t y;
  wchar_t x;
  chunk_conflict *c_local;
  
  c_00 = (chunk *)cave_new(c->height,c->width);
  for (new._0_4_ = L'\0'; (wchar_t)new < c_00->height; new._0_4_ = (wchar_t)new + L'\x01') {
    for (new._4_4_ = L'\0'; new._4_4_ < c_00->width; new._4_4_ = new._4_4_ + L'\x01') {
      lVar1 = (loc_conflict)loc(new._4_4_,(wchar_t)new);
      psVar2 = square((chunk *)c,lVar1);
      c_00->squares[(wchar_t)new][new._4_4_].feat = psVar2->feat;
      lVar1 = (loc_conflict)loc(new._4_4_,(wchar_t)new);
      psVar2 = square(c_00,lVar1);
      flags1 = psVar2->info;
      lVar1 = (loc_conflict)loc(new._4_4_,(wchar_t)new);
      psVar2 = square((chunk *)c,lVar1);
      flag_copy(flags1,psVar2->info,3);
    }
  }
  return (chunk_conflict *)c_00;
}

Assistant:

struct chunk *chunk_write(struct chunk *c)
{
	int x, y;

	struct chunk *new = cave_new(c->height, c->width);

	/* Write the location stuff */
	for (y = 0; y < new->height; y++) {
		for (x = 0; x < new->width; x++) {
			/* Terrain */
			new->squares[y][x].feat = square(c, loc(x, y))->feat;
			sqinfo_copy(square(new, loc(x, y))->info, square(c, loc(x, y))->info);
		}
	}

	return new;
}